

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sat.cpp
# Opt level: O3

int __thiscall SAT::getLazyVar(SAT *this,ChannelInfo ci)

{
  uint in_EAX;
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  undefined8 uStack_28;
  
  uVar2 = (this->var_free_list).sz;
  if (uVar2 == 0) {
    uStack_28._0_4_ = in_EAX;
    uVar1 = newVar(this,1,ci);
    uStack_28 = (ulong)(uint)uStack_28;
    vec<int>::push(&this->num_used,(int *)((long)&uStack_28 + 4));
  }
  else {
    uVar2 = uVar2 - 1;
    uVar1 = (this->var_free_list).data[uVar2];
    uVar3 = (ulong)uVar1;
    (this->var_free_list).sz = uVar2;
    fprintf(_stderr,"reuse %d\n",uVar3);
    (this->c_info).data[uVar3] = ci;
    (this->activity).data[uVar3] = 0.0;
    (this->polarity).data[uVar3] = true;
    *(undefined1 *)((this->flags).data + uVar3) = 7;
  }
  return uVar1;
}

Assistant:

int SAT::getLazyVar(ChannelInfo ci) {
	int v;
	if (var_free_list.size() != 0) {
		v = var_free_list.last();
		var_free_list.pop();
		fprintf(stderr, "reuse %d\n", v);
		assert(assigns[v] == toInt(l_Undef));
		assert(watches[2 * v].size() == 0);
		assert(watches[2 * v + 1].size() == 0);
		assert(num_used[v] == 0);
		c_info[v] = ci;
		activity[v] = 0;
		polarity[v] = true;
		flags[v] = LitFlags(true, true, true);
	} else {
		v = newVar(1, ci);
		num_used.push(0);
	}
	//	flags[v].setDecidable(false);
	return v;
}